

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_reflect_set(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  int64_t iVar2;
  JSValue this_obj;
  JSValue val;
  JSAtom prop;
  int iVar3;
  JSValueUnion JVar4;
  JSValue JVar5;
  int64_t iStackY_70;
  JSValueUnion local_48;
  int64_t iStack_40;
  
  local_48 = (JSValueUnion)(argv->u).ptr;
  JVar5 = *argv;
  iStack_40 = argv->tag;
  if (3 < argc) {
    local_48 = (JSValueUnion)argv[3].u.ptr;
    iStack_40 = argv[3].tag;
  }
  if ((int)argv->tag == -1) {
    piVar1 = (int *)argv[2].u.ptr;
    iVar2 = argv[2].tag;
    val = argv[2];
    prop = JS_ValueToAtom(ctx,argv[1]);
    iStackY_70 = 6;
    if (prop != 0) {
      if (0xfffffff4 < (uint)iVar2) {
        *piVar1 = *piVar1 + 1;
      }
      this_obj.tag = iStack_40;
      this_obj.u.float64 = local_48.float64;
      iVar3 = JS_SetPropertyGeneric(ctx,JVar5,prop,val,this_obj,0);
      JS_FreeAtom(ctx,prop);
      if (-1 < iVar3) {
        JVar4._1_7_ = 0;
        JVar4.int32._0_1_ = iVar3 != 0;
        iStackY_70 = 1;
        goto LAB_0010df2e;
      }
    }
    JVar4.float64 = 0.0;
  }
  else {
    JVar4.float64 = 0.0;
    JS_ThrowTypeError(ctx,"not an object",this_val.tag);
    iStackY_70 = 6;
  }
LAB_0010df2e:
  JVar5.tag = iStackY_70;
  JVar5.u.float64 = JVar4.float64;
  return JVar5;
}

Assistant:

static JSValue js_reflect_set(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    JSValueConst obj, prop, val, receiver;
    int ret;
    JSAtom atom;

    obj = argv[0];
    prop = argv[1];
    val = argv[2];
    if (argc > 3)
        receiver = argv[3];
    else
        receiver = obj;
    if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);
    atom = JS_ValueToAtom(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL))
        return JS_EXCEPTION;
    ret = JS_SetPropertyGeneric(ctx, obj, atom,
                                JS_DupValue(ctx, val), receiver, 0);
    JS_FreeAtom(ctx, atom);
    if (ret < 0)
        return JS_EXCEPTION;
    else
        return JS_NewBool(ctx, ret);
}